

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::MakeCidentifier(string *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  string permited_chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + s->_M_string_length);
  lVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x51aed9,0);
  if (lVar2 == 0) {
    std::operator+(&local_38,"_",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789",
             "");
  uVar3 = 0;
  while( true ) {
    uVar3 = std::__cxx11::string::find_first_not_of
                      ((char *)__return_storage_ptr__,(ulong)local_38._M_dataplus._M_p,uVar3);
    if (uVar3 == 0xffffffffffffffff) break;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = '_';
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::MakeCidentifier(const kwsys_stl::string& s)
{
  kwsys_stl::string str(s);
  if (str.find_first_of("0123456789") == 0)
    {
    str = "_" + str;
    }

  kwsys_stl::string permited_chars("_"
                             "abcdefghijklmnopqrstuvwxyz"
                             "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             "0123456789");
  kwsys_stl::string::size_type pos = 0;
  while ((pos = str.find_first_not_of(permited_chars, pos)) != kwsys_stl::string::npos)
    {
    str[pos] = '_';
    }
  return str;
}